

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ReferencedByTessellationQueryCase::iterate
          (ReferencedByTessellationQueryCase *this)

{
  GetNameFunc p_Var1;
  size_type *psVar2;
  TestLog *pTVar3;
  Context *pCVar4;
  RenderContext *renderCtx;
  size_type sVar5;
  int iVar6;
  GLuint GVar7;
  GLenum GVar8;
  undefined4 extraout_var;
  Context *pCVar9;
  undefined8 *puVar10;
  long *plVar11;
  TestContext *code;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  size_type *psVar13;
  char *pcVar14;
  pointer pcVar15;
  char *pcVar16;
  long lVar17;
  undefined1 local_558 [8];
  undefined1 local_550 [8];
  size_type local_548;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_540;
  ScopedLogSection section_1;
  value_type local_528;
  deUint32 props [1];
  undefined4 uStack_504;
  undefined1 local_4f8 [16];
  GLsizei length_1;
  undefined4 uStack_4e4;
  _Alloc_hider local_4e0;
  undefined1 local_4d8 [24];
  GLint referenced;
  size_type local_4b8;
  undefined1 local_4b0 [16];
  CallLogWrapper gl;
  GLsizei length;
  undefined4 uStack_484;
  size_type local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  ScopedLogSection section;
  size_type local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  GLint referenced_1;
  undefined4 uStack_444;
  value_type local_440;
  size_type __dnew;
  _func_int **local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410 [6];
  ios_base local_3b0 [8];
  ios_base local_3a8 [264];
  string local_2a0;
  string local_280;
  Context *local_260;
  Context local_250;
  undefined1 local_230 [16];
  ResultCollector result;
  undefined1 local_1d0 [8];
  pointer local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0 [8];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_140;
  undefined1 local_120 [32];
  ShaderProgram program;
  
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  __dnew = (size_type)local_410;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__dnew," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&result,pTVar3,(string *)&__dnew);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew != local_410) {
    operator_delete((void *)__dnew,local_410[0]._M_allocated_capacity + 1);
  }
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  code = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  glu::CallLogWrapper::CallLogWrapper(&gl,(Functions *)CONCAT44(extraout_var,iVar6),code->m_log);
  pCVar4 = (this->super_TestCase).m_context;
  renderCtx = pCVar4->m_renderCtx;
  local_120[0x10] = 0;
  local_120._17_8_ = 0;
  local_120._0_8_ = (pointer)0x0;
  local_120[8] = 0;
  local_120._9_7_ = 0;
  memset(local_1d0,0,0xac);
  _props = (Context *)local_4f8;
  __dnew = 0x75;
  pCVar9 = (Context *)std::__cxx11::string::_M_create((ulong *)props,(ulong)&__dnew);
  sVar5 = __dnew;
  local_4f8._0_8_ = __dnew;
  _props = pCVar9;
  memcpy(pCVar9,
         "${GLSL_VERSION_DECL}\nvoid main (void)\n{\n\tgl_Position = vec4(float(gl_VertexID), float(gl_VertexID / 2), 0.0, 1.0);\n}\n"
         ,0x75);
  *(undefined1 *)((long)&pCVar9->m_testCtx + sVar5) = 0;
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)&section,(_anonymous_namespace_ *)pCVar4,_props,(char *)code);
  local_558 = (undefined1  [8])((ulong)(uint)local_558._4_4_ << 0x20);
  local_550 = (undefined1  [8])&aStack_540;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_550,section.m_log,(long)&(section.m_log)->m_log + local_460);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + ((ulong)local_558 & 0xffffffff) * 0x18),(value_type *)local_550);
  pCVar4 = (this->super_TestCase).m_context;
  _referenced = (Context *)local_4b0;
  __dnew = 0x7f;
  pCVar9 = (Context *)std::__cxx11::string::_M_create((ulong *)&referenced,(ulong)&__dnew);
  sVar5 = __dnew;
  local_4b0._0_8_ = __dnew;
  _referenced = pCVar9;
  memcpy(pCVar9,
         "${GLSL_VERSION_DECL}\nlayout (location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = vec4(0.0, 1.0, 0.0, 1.0);\n}\n"
         ,0x7f);
  local_4b8 = sVar5;
  *(undefined1 *)((long)&pCVar9->m_testCtx + sVar5) = 0;
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)&length,(_anonymous_namespace_ *)pCVar4,_referenced,(char *)code);
  section_1.m_log._0_4_ = 1;
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_528,CONCAT44(uStack_484,length),
             local_480 + CONCAT44(uStack_484,length));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + ((ulong)section_1.m_log & 0xffffffff) * 0x18),&local_528);
  pCVar4 = (this->super_TestCase).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&__dnew);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&__dnew,
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(vertices = 3) out;\nuniform highp vec4 "
             ,0x61);
  pcVar16 = "u_referenced";
  pcVar14 = "u_unreferenced";
  if (this->m_isCtrlCase != false) {
    pcVar14 = "u_referenced";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&__dnew,pcVar14,(ulong)(this->m_isCtrlCase ^ 1) * 2 + 0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&__dnew,";\nvoid main (void)\n{\n\tvec4 offset = ",0x24);
  pcVar14 = "u_unreferenced";
  if (this->m_isCtrlCase != false) {
    pcVar14 = "u_referenced";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&__dnew,pcVar14,(ulong)(this->m_isCtrlCase ^ 1) * 2 + 0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&__dnew,
             ";\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position + offset;\n\tgl_TessLevelInner[0] = 2.8;\n\tgl_TessLevelInner[1] = 2.8;\n\tgl_TessLevelOuter[0] = 2.8;\n\tgl_TessLevelOuter[1] = 2.8;\n\tgl_TessLevelOuter[2] = 2.8;\n\tgl_TessLevelOuter[3] = 2.8;\n}\n"
             ,0x106);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__dnew);
  std::ios_base::~ios_base(local_3b0);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_280,(_anonymous_namespace_ *)pCVar4,(Context *)local_250.m_contextInfo,
             (char *)code);
  length_1 = 3;
  local_4e0._M_p = local_4d8 + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffb20,local_280._M_dataplus._M_p,
             local_280._M_dataplus._M_p + local_280._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + (ulong)(uint)length_1 * 0x18),(value_type *)&stack0xfffffffffffffb20);
  pCVar4 = (this->super_TestCase).m_context;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&__dnew);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&__dnew,
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(triangles) in;\nuniform highp vec4 "
             ,0x5d);
  pcVar14 = "u_referenced";
  if (this->m_isCtrlCase != false) {
    pcVar14 = "u_unreferenced";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&__dnew,pcVar14,(ulong)this->m_isCtrlCase * 2 + 0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&__dnew,";\nvoid main (void)\n{\n\tvec4 offset = ",0x24);
  if (this->m_isCtrlCase != false) {
    pcVar16 = "u_unreferenced";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&__dnew,pcVar16,(ulong)this->m_isCtrlCase * 2 + 0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&__dnew,
             ";\n\tgl_Position = gl_TessCoord.x * gl_in[0].gl_Position\n\t            + gl_TessCoord.y * gl_in[1].gl_Position\n\t            + gl_TessCoord.z * gl_in[2].gl_Position\n\t            + offset;\n}\n"
             ,0xba);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__dnew);
  std::ios_base::~ios_base(local_3b0);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2a0,(_anonymous_namespace_ *)pCVar4,local_260,(char *)code);
  _referenced_1 = (code *)CONCAT44(uStack_444,4);
  local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_440,local_2a0._M_dataplus._M_p,
             local_2a0._M_dataplus._M_p + local_2a0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + ((ulong)_referenced_1 & 0xffffffff) * 0x18),&local_440);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if (local_260 != &local_250) {
    operator_delete(local_260,(ulong)((long)&(local_250.m_testCtx)->m_platform + 1));
  }
  if (local_4e0._M_p != local_4d8 + 8) {
    operator_delete(local_4e0._M_p,local_4d8._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if (local_250.m_contextInfo != (ContextInfo *)local_230) {
    operator_delete(local_250.m_contextInfo,local_230._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(uStack_484,length) != &local_478) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(uStack_484,length),local_478._M_allocated_capacity + 1);
  }
  if (_referenced != (Context *)local_4b0) {
    operator_delete(_referenced,(ulong)((long)(Platform **)local_4b0._0_8_ + 1));
  }
  if (local_550 != (undefined1  [8])&aStack_540) {
    operator_delete((void *)local_550,aStack_540._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)section.m_log != &local_458) {
    operator_delete(section.m_log,local_458._M_allocated_capacity + 1);
  }
  if (_props != (Context *)local_4f8) {
    operator_delete(_props,(ulong)((long)(Platform **)local_4f8._0_8_ + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_120);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_140);
  lVar17 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + lVar17));
    lVar17 = lVar17 + -0x18;
  } while (lVar17 != -0x18);
  gl.m_enableLog = true;
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program);
  __dnew = (size_type)local_410;
  if (program.m_program.m_info.linkOk == false) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&__dnew,"failed to build program","");
    tcu::ResultCollector::fail(&result,(string *)&__dnew);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__dnew != local_410) {
      operator_delete((void *)__dnew,local_410[0]._M_allocated_capacity + 1);
    }
    goto LAB_0141f43f;
  }
  _props = (Context *)CONCAT44(uStack_504,0x9308 - (uint)this->m_isCtrlCase);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__dnew,"UnreferencedUniform","");
  local_1d0 = (undefined1  [8])local_1c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1d0,"Unreferenced uniform u_unreferenced","");
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar3,(string *)&__dnew,(string *)local_1d0);
  if (local_1d0 != (undefined1  [8])local_1c0) {
    operator_delete((void *)local_1d0,(ulong)(local_1c0[0]._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew != local_410) {
    operator_delete((void *)__dnew,local_410[0]._M_allocated_capacity + 1);
  }
  length = 0;
  _referenced = (Context *)((ulong)_referenced & 0xffffffff00000000);
  GVar7 = glu::CallLogWrapper::glGetProgramResourceIndex
                    (&gl,program.m_program.m_program,0x92e1,"u_unreferenced");
  __dnew = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_418);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_418,"u_unreferenced resource index: ",0x1f);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_418);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&__dnew,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_418);
  std::ios_base::~ios_base(local_3a8);
  if (GVar7 == 0xffffffff) {
    __dnew = (size_type)local_410;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&__dnew,"resourcePos was GL_INVALID_INDEX","");
    tcu::ResultCollector::fail(&result,(string *)&__dnew);
LAB_0141f0f9:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__dnew != local_410) {
      operator_delete((void *)__dnew,local_410[0]._M_allocated_capacity + 1);
    }
  }
  else {
    glu::CallLogWrapper::glGetProgramResourceiv
              (&gl,program.m_program.m_program,0x92e1,GVar7,1,props,1,&length,&referenced);
    __dnew = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_418);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_418,"Query ",6);
    local_1d0 = (undefined1  [8])glu::getProgramResourcePropertyName;
    local_1c8 = (pointer)CONCAT44(local_1c8._4_4_,props[0]);
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_1d0,(ostream *)&local_418);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_418,", got ",6);
    std::ostream::operator<<((ostringstream *)&local_418,length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_418," value(s), value[0] = ",0x16);
    local_558 = (undefined1  [8])glu::getBooleanName;
    local_550._0_4_ = referenced;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_558,(ostream *)&local_418);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&__dnew,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_418);
    std::ios_base::~ios_base(local_3a8);
    GVar8 = glu::CallLogWrapper::glGetError(&gl);
    if (GVar8 != 0) {
      psVar2 = &local_528._M_string_length;
      section_1.m_log = (TestLog *)psVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&section_1,"Got Error ","");
      _referenced_1 = glu::getErrorName;
      local_440._M_dataplus._M_p._0_4_ = GVar8;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_((string *)&length_1,&referenced_1);
      pcVar15 = (pointer)0xf;
      if (section_1.m_log != (TestLog *)psVar2) {
        pcVar15 = (pointer)local_528._M_string_length;
      }
      if (pcVar15 < local_4e0._M_p + local_528._M_dataplus._M_p) {
        pcVar15 = (pointer)0xf;
        if ((undefined1 *)CONCAT44(uStack_4e4,length_1) != local_4d8) {
          pcVar15 = (pointer)local_4d8._0_8_;
        }
        if (pcVar15 < local_4e0._M_p + local_528._M_dataplus._M_p) goto LAB_0141ee5f;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&length_1,0,(char *)0x0,(ulong)section_1.m_log);
      }
      else {
LAB_0141ee5f:
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append((char *)&section_1,CONCAT44(uStack_4e4,length_1));
      }
      local_558 = (undefined1  [8])&local_548;
      p_Var1 = (GetNameFunc)(puVar10 + 2);
      if ((GetNameFunc)*puVar10 == p_Var1) {
        local_548 = *(size_type *)p_Var1;
        aStack_540._M_allocated_capacity = puVar10[3];
      }
      else {
        local_548 = *(size_type *)p_Var1;
        local_558 = (undefined1  [8])*puVar10;
      }
      local_550 = (undefined1  [8])puVar10[1];
      *puVar10 = p_Var1;
      puVar10[1] = 0;
      *p_Var1 = (code)0x0;
      plVar11 = (long *)std::__cxx11::string::append(local_558);
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 == paVar12) {
        local_1c0[0]._0_8_ = paVar12->_M_allocated_capacity;
        local_1c0[0]._8_8_ = plVar11[3];
        local_1d0 = (undefined1  [8])local_1c0;
      }
      else {
        local_1c0[0]._0_8_ = paVar12->_M_allocated_capacity;
        local_1d0 = (undefined1  [8])*plVar11;
      }
      local_1c8 = (pointer)plVar11[1];
      *plVar11 = (long)paVar12;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append(local_1d0);
      psVar13 = (size_type *)(plVar11 + 2);
      if ((size_type *)*plVar11 == psVar13) {
        local_410[0]._0_8_ = *psVar13;
        local_410[0]._8_8_ = plVar11[3];
        __dnew = (size_type)local_410;
      }
      else {
        local_410[0]._0_8_ = *psVar13;
        __dnew = (size_type)*plVar11;
      }
      local_418 = (_func_int **)plVar11[1];
      *plVar11 = (long)psVar13;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      tcu::ResultCollector::fail(&result,(string *)&__dnew);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__dnew != local_410) {
        operator_delete((void *)__dnew,local_410[0]._M_allocated_capacity + 1);
      }
      if (local_1d0 != (undefined1  [8])local_1c0) {
        operator_delete((void *)local_1d0,(ulong)(local_1c0[0]._M_allocated_capacity + 1));
      }
      if (local_558 != (undefined1  [8])&local_548) {
        operator_delete((void *)local_558,local_548 + 1);
      }
      if ((undefined1 *)CONCAT44(uStack_4e4,length_1) != local_4d8) {
        operator_delete((undefined1 *)CONCAT44(uStack_4e4,length_1),(ulong)(local_4d8._0_8_ + 1));
      }
      if (section_1.m_log != (TestLog *)psVar2) {
        operator_delete(section_1.m_log,(ulong)(local_528._M_string_length + 1));
      }
    }
    if ((length == 0) || (referenced != 0)) {
      __dnew = (size_type)local_410;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__dnew,"expected GL_FALSE","");
      tcu::ResultCollector::fail(&result,(string *)&__dnew);
      goto LAB_0141f0f9;
    }
  }
  tcu::TestLog::endSection(section.m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  __dnew = (size_type)local_410;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__dnew,"ReferencedUniform","");
  local_1d0 = (undefined1  [8])local_1c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1d0,"Referenced uniform u_referenced","");
  tcu::ScopedLogSection::ScopedLogSection(&section_1,pTVar3,(string *)&__dnew,(string *)local_1d0);
  if (local_1d0 != (undefined1  [8])local_1c0) {
    operator_delete((void *)local_1d0,(ulong)(local_1c0[0]._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__dnew != local_410) {
    operator_delete((void *)__dnew,local_410[0]._M_allocated_capacity + 1);
  }
  length_1 = 0;
  _referenced_1 = (code *)((ulong)_referenced_1 & 0xffffffff00000000);
  GVar7 = glu::CallLogWrapper::glGetProgramResourceIndex
                    (&gl,program.m_program.m_program,0x92e1,"u_referenced");
  __dnew = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_418);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_418,"u_referenced resource index: ",0x1d);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_418);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&__dnew,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_418);
  std::ios_base::~ios_base(local_3a8);
  if (GVar7 == 0xffffffff) {
    __dnew = (size_type)local_410;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&__dnew,"resourcePos was GL_INVALID_INDEX","");
    tcu::ResultCollector::fail(&result,(string *)&__dnew);
LAB_0141f418:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__dnew != local_410) {
      operator_delete((void *)__dnew,local_410[0]._M_allocated_capacity + 1);
    }
  }
  else {
    glu::CallLogWrapper::glGetProgramResourceiv
              (&gl,program.m_program.m_program,0x92e1,GVar7,1,props,1,&length_1,&referenced_1);
    __dnew = (size_type)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_418);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_418,"Query ",6);
    local_1d0 = (undefined1  [8])glu::getProgramResourcePropertyName;
    local_1c8 = (pointer)CONCAT44(local_1c8._4_4_,props[0]);
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_1d0,(ostream *)&local_418);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_418,", got ",6);
    std::ostream::operator<<((ostringstream *)&local_418,length_1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_418," value(s), value[0] = ",0x16);
    local_558 = (undefined1  [8])glu::getBooleanName;
    local_550._0_4_ = referenced_1;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)local_558,(ostream *)&local_418);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&__dnew,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_418);
    std::ios_base::~ios_base(local_3a8);
    GVar8 = glu::CallLogWrapper::glGetError(&gl);
    glu::checkError(GVar8,"query resource",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                    ,0x1ba5);
    if ((length_1 == 0) || (referenced_1 != 1)) {
      __dnew = (size_type)local_410;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__dnew,"expected GL_TRUE","");
      tcu::ResultCollector::fail(&result,(string *)&__dnew);
      goto LAB_0141f418;
    }
  }
  tcu::TestLog::endSection(section_1.m_log);
LAB_0141f43f:
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::ShaderProgram::~ShaderProgram(&program);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result.m_message._M_dataplus._M_p != &result.m_message.field_2) {
    operator_delete(result.m_message._M_dataplus._M_p,
                    result.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result.m_prefix._M_dataplus._M_p != &result.m_prefix.field_2) {
    operator_delete(result.m_prefix._M_dataplus._M_p,
                    result.m_prefix.field_2._M_allocated_capacity + 1);
  }
  return STOP;
}

Assistant:

ReferencedByTessellationQueryCase::IterateResult ReferencedByTessellationQueryCase::iterate (void)
{
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	glu::ShaderProgram		program	(m_context.getRenderContext(), glu::ProgramSources()
																	<< glu::VertexSource(specializeShader(m_context, getVertexSource().c_str()))
																	<< glu::FragmentSource(specializeShader(m_context, getFragmentSource().c_str()))
																	<< glu::TessellationControlSource(specializeShader(m_context, getTessCtrlSource().c_str()))
																	<< glu::TessellationEvaluationSource(specializeShader(m_context, getTessEvalSource().c_str())));

	gl.enableLogging(true);

	m_testCtx.getLog() << program;
	if (!program.isOk())
		result.fail("failed to build program");
	else
	{
		const deUint32 props[1] = { (deUint32)((m_isCtrlCase) ? (GL_REFERENCED_BY_TESS_CONTROL_SHADER) : (GL_REFERENCED_BY_TESS_EVALUATION_SHADER)) };

		{
			const tcu::ScopedLogSection section		(m_testCtx.getLog(), "UnreferencedUniform", "Unreferenced uniform u_unreferenced");
			deUint32					resourcePos;
			glw::GLsizei				length		= 0;
			glw::GLint					referenced	= 0;

			resourcePos = gl.glGetProgramResourceIndex(program.getProgram(), GL_UNIFORM, "u_unreferenced");
			m_testCtx.getLog() << tcu::TestLog::Message << "u_unreferenced resource index: " << resourcePos << tcu::TestLog::EndMessage;

			if (resourcePos == GL_INVALID_INDEX)
				result.fail("resourcePos was GL_INVALID_INDEX");
			else
			{
				gl.glGetProgramResourceiv(program.getProgram(), GL_UNIFORM, resourcePos, 1, props, 1, &length, &referenced);
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "Query " << glu::getProgramResourcePropertyStr(props[0])
					<< ", got " << length << " value(s), value[0] = " << glu::getBooleanStr(referenced)
					<< tcu::TestLog::EndMessage;

				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "query resource");

				if (length == 0 || referenced != GL_FALSE)
					result.fail("expected GL_FALSE");
			}
		}

		{
			const tcu::ScopedLogSection section		(m_testCtx.getLog(), "ReferencedUniform", "Referenced uniform u_referenced");
			deUint32					resourcePos;
			glw::GLsizei				length		= 0;
			glw::GLint					referenced	= 0;

			resourcePos = gl.glGetProgramResourceIndex(program.getProgram(), GL_UNIFORM, "u_referenced");
			m_testCtx.getLog() << tcu::TestLog::Message << "u_referenced resource index: " << resourcePos << tcu::TestLog::EndMessage;

			if (resourcePos == GL_INVALID_INDEX)
				result.fail("resourcePos was GL_INVALID_INDEX");
			else
			{
				gl.glGetProgramResourceiv(program.getProgram(), GL_UNIFORM, resourcePos, 1, props, 1, &length, &referenced);
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "Query " << glu::getProgramResourcePropertyStr(props[0])
					<< ", got " << length << " value(s), value[0] = " << glu::getBooleanStr(referenced)
					<< tcu::TestLog::EndMessage;

				GLU_EXPECT_NO_ERROR(gl.glGetError(), "query resource");

				if (length == 0 || referenced != GL_TRUE)
					result.fail("expected GL_TRUE");
			}
		}
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}